

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::HasEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  uint32_t uVar4;
  bool bVar5;
  
  ppNVar1 = (this->rep_->nodes_).ptr_;
  pNVar2 = ppNVar1[x.handle & 0xffffffff];
  bVar5 = false;
  if ((pNVar2 != (Node *)0x0) && (bVar5 = false, pNVar2->version == (uint32_t)(x.handle >> 0x20))) {
    pNVar3 = ppNVar1[y.handle & 0xffffffff];
    bVar5 = false;
    if ((pNVar3 != (Node *)0x0) && (pNVar3->version == (uint32_t)(y.handle >> 0x20))) {
      uVar4 = anon_unknown_0::NodeSet::FindIndex(&pNVar2->out,(int32_t)y.handle);
      bVar5 = (pNVar2->out).table_.ptr_[uVar4] == (int32_t)y.handle;
    }
  }
  return bVar5;
}

Assistant:

bool GraphCycles::HasEdge(GraphId x, GraphId y) const {
  Node* xn = FindNode(rep_, x);
  return xn && FindNode(rep_, y) && xn->out.contains(NodeIndex(y));
}